

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

nsync_dll_element_ *
nsync::skip_past_same_condition(nsync_dll_list_ waiter_list,nsync_dll_element_ *p)

{
  nsync_dll_element_ *e;
  nsync_dll_element_ *last_with_same_condition;
  nsync_dll_element_ *next;
  nsync_dll_element_ *p_local;
  nsync_dll_list_ waiter_list_local;
  
  e = (nsync_dll_element_ *)(*(long *)(*(long *)((long)p->container + 0x70) + 0x10) + 0x110);
  if ((e == p) || (e == p->prev)) {
    last_with_same_condition = nsync_dll_next_(waiter_list,p);
  }
  else {
    last_with_same_condition = nsync_dll_next_(waiter_list,e);
  }
  return last_with_same_condition;
}

Assistant:

static nsync_dll_element_ *skip_past_same_condition (
	nsync_dll_list_ waiter_list, nsync_dll_element_ *p) {
	nsync_dll_element_ *next;
	nsync_dll_element_ *last_with_same_condition =
		&DLL_WAITER_SAMECOND (DLL_WAITER (p)->same_condition.prev)->nw.q;
	if (last_with_same_condition != p && last_with_same_condition != p->prev) {
		/* First in set with same condition, so skip to end.  */
		next = nsync_dll_next_ (waiter_list, last_with_same_condition);
	} else {
		next = nsync_dll_next_ (waiter_list, p);
	}
	return (next);
}